

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MorseBondType.hpp
# Opt level: O0

void __thiscall
OpenMD::MorseBondType::calcForce(MorseBondType *this,RealType r,RealType *V,RealType *dVdr)

{
  double *in_RDX;
  double *in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  RealType eterm2;
  RealType eterm;
  RealType dr;
  
  dVar1 = exp(-*(double *)(in_RDI + 0x18) * (in_XMM0_Qa - *(double *)(in_RDI + 8)));
  *in_RSI = *(double *)(in_RDI + 0x10) * ((1.0 - (dVar1 + dVar1)) + dVar1 * dVar1);
  *in_RDX = *(double *)(in_RDI + 0x10) * 2.0 * *(double *)(in_RDI + 0x18) * (dVar1 - dVar1 * dVar1);
  return;
}

Assistant:

virtual void calcForce(RealType r, RealType& V, RealType& dVdr) {
      RealType dr, eterm, eterm2;

      dr     = r - r0;
      eterm  = exp(-beta * dr);
      eterm2 = eterm * eterm;

      V    = De * (1 - 2.0 * eterm + eterm2);
      dVdr = 2.0 * De * beta * (eterm - eterm2);
    }